

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>
fmt::v8::detail::
copy_str<char16_t,char_const*,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
          (char *begin,char *end,back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> out)

{
  undefined8 in_RAX;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  for (; begin != end; begin = begin + 1) {
    uStack_28 = CONCAT26((short)*begin,(undefined6)uStack_28);
    buffer<char16_t>::push_back(out.container,(char16_t *)((long)&uStack_28 + 6));
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)out.container;
}

Assistant:

FMT_CONSTEXPR auto copy_str(InputIt begin, InputIt end, OutputIt out)
    -> OutputIt {
  while (begin != end) *out++ = static_cast<Char>(*begin++);
  return out;
}